

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void DL::Expressions::print_val(Data *d,stringstream *stream)

{
  bool bVar1;
  DataType DVar2;
  Integer IVar3;
  ostream *poVar4;
  DataGroup *pDVar5;
  size_t sVar6;
  vector_t<Data> *pvVar7;
  size_type sVar8;
  reference d_00;
  char *pcVar9;
  Float FVar10;
  __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_> local_110;
  Data *local_108;
  undefined1 local_100 [32];
  __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_> local_e0;
  anon_union_8_3_90dad22a_for_Data_2 local_d8;
  const_iterator it;
  Data x;
  size_t i;
  undefined1 local_38 [40];
  stringstream *stream_local;
  Data *d_local;
  
  local_38._32_8_ = stream;
  stream_local = (stringstream *)d;
  DVar2 = Data::type(d);
  switch(DVar2) {
  case DT_Group:
    pDVar5 = Data::getGroup((Data *)stream_local);
    bVar1 = DataGroup::isArray(pDVar5);
    if (bVar1) {
      std::operator<<((ostream *)(local_38._32_8_ + 0x10),"[");
    }
    else {
      poVar4 = std::operator<<((ostream *)(local_38._32_8_ + 0x10),"(");
      Data::getGroup((Data *)stream_local);
      DataGroup::id_abi_cxx11_((DataGroup *)&i);
      poVar4 = std::operator<<(poVar4,(string *)&i);
      std::operator<<(poVar4," ");
      std::__cxx11::string::~string((string *)&i);
    }
    x._88_8_ = 0;
    while( true ) {
      pDVar5 = Data::getGroup((Data *)stream_local);
      sVar6 = DataGroup::anonymousCount(pDVar5);
      if (sVar6 <= (ulong)x._88_8_) break;
      pDVar5 = Data::getGroup((Data *)stream_local);
      DataGroup::at((Data *)&it,pDVar5,x._88_8_);
      print_val((Data *)&it,(stringstream *)local_38._32_8_);
      pDVar5 = Data::getGroup((Data *)stream_local);
      sVar6 = DataGroup::anonymousCount(pDVar5);
      if (x._88_8_ != sVar6 - 1) {
        std::operator<<((ostream *)(local_38._32_8_ + 0x10),", ");
      }
      Data::~Data((Data *)&it);
      x._88_8_ = x._88_8_ + 1;
    }
    pDVar5 = Data::getGroup((Data *)stream_local);
    sVar6 = DataGroup::anonymousCount(pDVar5);
    if (sVar6 != 0) {
      pDVar5 = Data::getGroup((Data *)stream_local);
      pvVar7 = DataGroup::getNamedEntries(pDVar5);
      sVar8 = std::vector<DL::Data,_std::allocator<DL::Data>_>::size(pvVar7);
      if (sVar8 != 0) {
        std::operator<<((ostream *)(local_38._32_8_ + 0x10),", ");
      }
    }
    pDVar5 = Data::getGroup((Data *)stream_local);
    pvVar7 = DataGroup::getNamedEntries(pDVar5);
    local_d8 = (anon_union_8_3_90dad22a_for_Data_2)
               std::vector<DL::Data,_std::allocator<DL::Data>_>::begin(pvVar7);
    while( true ) {
      pDVar5 = Data::getGroup((Data *)stream_local);
      pvVar7 = DataGroup::getNamedEntries(pDVar5);
      local_e0._M_current = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end(pvVar7);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                          *)&local_d8,&local_e0);
      if (!bVar1) break;
      poVar4 = std::operator<<((ostream *)(local_38._32_8_ + 0x10),":");
      __gnu_cxx::
      __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
      operator->((__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                  *)&local_d8);
      Data::key_abi_cxx11_((Data *)local_100);
      poVar4 = std::operator<<(poVar4,(string *)local_100);
      std::operator<<(poVar4," ");
      std::__cxx11::string::~string((string *)local_100);
      d_00 = __gnu_cxx::
             __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
             ::operator*((__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                          *)&local_d8);
      print_val(d_00,(stringstream *)local_38._32_8_);
      local_108 = (Data *)__gnu_cxx::
                          __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                          ::operator++((__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                        *)&local_d8,0);
      pDVar5 = Data::getGroup((Data *)stream_local);
      pvVar7 = DataGroup::getNamedEntries(pDVar5);
      local_110._M_current = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end(pvVar7);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                          *)&local_d8,&local_110);
      if (bVar1) {
        std::operator<<((ostream *)(local_38._32_8_ + 0x10),", ");
      }
    }
    pDVar5 = Data::getGroup((Data *)stream_local);
    bVar1 = DataGroup::isArray(pDVar5);
    if (bVar1) {
      std::operator<<((ostream *)(local_38._32_8_ + 0x10),"]");
    }
    else {
      std::operator<<((ostream *)(local_38._32_8_ + 0x10),")");
    }
    break;
  case DT_Integer:
    poVar4 = (ostream *)(local_38._32_8_ + 0x10);
    IVar3 = Data::getInt((Data *)stream_local);
    std::ostream::operator<<(poVar4,IVar3);
    break;
  case DT_Float:
    poVar4 = (ostream *)(local_38._32_8_ + 0x10);
    FVar10 = Data::getFloat((Data *)stream_local);
    std::ostream::operator<<(poVar4,FVar10);
    break;
  case DT_Bool:
    poVar4 = (ostream *)(local_38._32_8_ + 0x10);
    bVar1 = Data::getBool((Data *)stream_local);
    pcVar9 = "false";
    if (bVar1) {
      pcVar9 = "true";
    }
    std::operator<<(poVar4,pcVar9);
    break;
  case DT_String:
    poVar4 = (ostream *)(local_38._32_8_ + 0x10);
    Data::getString_abi_cxx11_((Data *)local_38);
    std::operator<<(poVar4,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    break;
  default:
    std::operator<<((ostream *)(local_38._32_8_ + 0x10),"###UNKNOWN### ");
  }
  return;
}

Assistant:

static void print_val(const Data& d, std::stringstream& stream)
{
	switch (d.type()) {
	case DT_Bool:
		stream << (d.getBool() ? "true" : "false");
		break;
	case DT_Integer:
		stream << d.getInt();
		break;
	case DT_Float:
		stream << d.getFloat();
		break;
	case DT_String:
		stream << d.getString();
		break;
	case DT_Group:
		if (d.getGroup().isArray())
			stream << "[";
		else
			stream << "(" << d.getGroup().id() << " ";

		for (size_t i = 0; i < d.getGroup().anonymousCount(); ++i) {
			Data x = d.getGroup().at(i);
			print_val(x, stream);

			if (i != d.getGroup().anonymousCount() - 1)
				stream << ", ";
		}

		if (d.getGroup().anonymousCount() > 0 && d.getGroup().getNamedEntries().size() > 0)
			stream << ", ";

		for (auto it = d.getGroup().getNamedEntries().begin();
			 it != d.getGroup().getNamedEntries().end();) {
			stream << ":" << it->key() << " ";
			print_val(*it, stream);

			it++;
			if (it != d.getGroup().getNamedEntries().end())
				stream << ", ";
		}

		if (d.getGroup().isArray())
			stream << "]";
		else
			stream << ")";

		break;
	default:
		stream << "###UNKNOWN### ";
		break;
	}
}